

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  LogSeverity LVar1;
  size_t sVar2;
  LogMessageData *pLVar3;
  char *pcVar4;
  ulong uVar5;
  long *plVar6;
  bool bVar7;
  char *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  size_t __n;
  int iVar11;
  undefined8 local_38;
  
  sVar2 = this->data_->num_chars_to_log_;
  if ((sVar2 == 0) || (this->data_->message_text_[sVar2 - 1] != '\n')) {
    RawLog__(FATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,0x6d4,"Check %s failed: %s",
             "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
             ,"");
  }
  if (SendToLog()::already_warned_before_initgoogle == '\0') {
    bVar7 = IsGoogleLoggingInitialized();
    if (!bVar7) {
      SendToLog();
    }
  }
  if ((fLB::FLAGS_logtostderr == '\0') && (fLB::FLAGS_logtostdout == '\0')) {
    bVar7 = IsGoogleLoggingInitialized();
    if (bVar7) {
      pLVar3 = this->data_;
      LogDestination::LogToAllLogfiles
                (pLVar3->severity_,&(this->time_).timestamp_,pLVar3->message_text_,
                 pLVar3->num_chars_to_log_);
      pLVar3 = this->data_;
      LVar1 = pLVar3->severity_;
      sVar2 = pLVar3->num_prefix_chars_;
      if ((fLI::FLAGS_stderrthreshold <= (int)LVar1) || (fLB::FLAGS_alsologtostderr == '\x01')) {
        ColoredWriteToStderrOrStdout(_stderr,LVar1,pLVar3->message_text_,pLVar3->num_chars_to_log_);
        pcVar8 = glog_internal_namespace_::ProgramInvocationShortName();
        glog_internal_namespace_::AlsoErrorWrite(LVar1,pcVar8,pLVar3->message_text_ + sVar2);
      }
      pLVar3 = this->data_;
      LogDestination::MaybeLogToEmail
                (pLVar3->severity_,pLVar3->message_text_,pLVar3->num_chars_to_log_);
      pLVar3 = this->data_;
      LVar1 = pLVar3->severity_;
      iVar11 = pLVar3->line_;
      pcVar8 = pLVar3->fullname_;
      pcVar4 = pLVar3->basename_;
      uVar5 = pLVar3->num_prefix_chars_;
      sVar2 = pLVar3->num_chars_to_log_;
      std::__shared_mutex_pthread::lock_shared
                ((__shared_mutex_pthread *)LogDestination::sink_mutex_);
      if (LogDestination::sinks_ != (long *)0x0) {
        lVar10 = LogDestination::sinks_[1] - *LogDestination::sinks_ >> 3;
        while (bVar7 = lVar10 != 0, lVar10 = lVar10 + -1, bVar7) {
          plVar6 = *(long **)(*LogDestination::sinks_ + lVar10 * 8);
          (**(code **)(*plVar6 + 0x10))
                    (plVar6,LVar1,pcVar8,pcVar4,iVar11,&this->time_,pLVar3->message_text_ + uVar5,
                     ~uVar5 + sVar2,iVar11);
        }
      }
      goto LAB_00114600;
    }
  }
  pLVar3 = this->data_;
  if ((fLB::FLAGS_logtostdout == '\x01') && ((int)pLVar3->severity_ < fLI::FLAGS_stderrthreshold)) {
    puVar9 = (undefined8 *)&stdout;
  }
  else {
    puVar9 = (undefined8 *)&stderr;
  }
  ColoredWriteToStderrOrStdout
            ((FILE *)*puVar9,pLVar3->severity_,pLVar3->message_text_,pLVar3->num_chars_to_log_);
  pLVar3 = this->data_;
  LVar1 = pLVar3->severity_;
  iVar11 = pLVar3->line_;
  pcVar8 = pLVar3->fullname_;
  pcVar4 = pLVar3->basename_;
  uVar5 = pLVar3->num_prefix_chars_;
  sVar2 = pLVar3->num_chars_to_log_;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)LogDestination::sink_mutex_);
  if (LogDestination::sinks_ != (long *)0x0) {
    lVar10 = LogDestination::sinks_[1] - *LogDestination::sinks_ >> 3;
    while (bVar7 = lVar10 != 0, lVar10 = lVar10 + -1, bVar7) {
      plVar6 = *(long **)(*LogDestination::sinks_ + lVar10 * 8);
      (**(code **)(*plVar6 + 0x10))
                (plVar6,LVar1,pcVar8,pcVar4,iVar11,&this->time_,pLVar3->message_text_ + uVar5,
                 ~uVar5 + sVar2);
    }
  }
LAB_00114600:
  pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  if ((this->data_->severity_ == FATAL) && (exit_on_dfatal == '\x01')) {
    if (this->data_->first_fatal_ == true) {
      crash_reason._0_8_ = fatal_msg_data_exclusive._30424_8_;
      crash_reason._8_4_ = fatal_msg_data_exclusive._30364_4_;
      crash_reason._16_8_ = fatal_msg_data_exclusive._30392_8_ + 0x13a194;
      crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,4);
      glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      uVar5 = this->data_->num_chars_to_log_;
      __n = 0xff;
      if (uVar5 < 0xff) {
        __n = uVar5;
      }
      memcpy(&fatal_message,this->data_->message_text_,__n);
      (&fatal_message)[__n] = 0;
      fatal_time = (this->time_).timestamp_.__d.__r;
    }
    if ((fLB::FLAGS_logtostderr == '\0') && (fLB::FLAGS_logtostdout == '\0')) {
      lVar10 = 0;
      do {
        if (*(long *)((long)&LogDestination::log_destinations_ + lVar10) != 0) {
          plVar6 = *(long **)(*(long *)((long)&LogDestination::log_destinations_ + lVar10) + 200);
          local_38 = 0;
          (**(code **)(*plVar6 + 0x18))(plVar6,1,&local_38,"",0);
        }
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x20);
    }
    std::mutex::unlock((mutex *)log_mutex);
    LogDestination::WaitForSinks(this->data_);
    write(2,"*** Check failure stack trace: ***\n",0x23);
    pcVar8 = glog_internal_namespace_::ProgramInvocationShortName();
    glog_internal_namespace_::AlsoErrorWrite(FATAL,pcVar8,"*** Check failure stack trace: ***\n");
    (*(code *)g_logging_fail_func)();
    return;
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                 data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
             "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] =
        "WARNING: Logging before InitGoogleLogging() is "
        "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || FLAGS_logtostdout || !IsGoogleLoggingInitialized()) {
    if (FLAGS_logtostdout) {
      ColoredWriteToStdout(data_->severity_, data_->message_text_,
                           data_->num_chars_to_log_);
    } else {
      ColoredWriteToStderr(data_->severity_, data_->message_text_,
                           data_->num_chars_to_log_);
    }

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(
        data_->severity_, data_->fullname_, data_->basename_, data_->line_,
        time_, data_->message_text_ + data_->num_prefix_chars_,
        (data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1));
  } else {
    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, time_.when(),
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_,
                                     data_->num_prefix_chars_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(
        data_->severity_, data_->fullname_, data_->basename_, data_->line_,
        time_, data_->message_text_ + data_->num_prefix_chars_,
        (data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1));
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const size_t copy =
          min(data_->num_chars_to_log_, sizeof(fatal_message) - 1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = time_.when();
    }

    if (!FLAGS_logtostderr && !FLAGS_logtostdout) {
      for (auto& log_destination : LogDestination::log_destinations_) {
        if (log_destination) {
          log_destination->logger_->Write(
              true, std::chrono::system_clock::time_point{}, "", 0);
        }
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    AlsoErrorWrite(GLOG_FATAL,
                   glog_internal_namespace_::ProgramInvocationShortName(),
                   message);
    Fail();
  }
}